

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O3

void __thiscall UDMFParser::ParseSidedef(UDMFParser *this,side_t *sd,intmapsidedef_t *sdt,int index)

{
  uint uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  char *pcVar12;
  intmapsidedef_t *this_00;
  ulong uVar13;
  FName key;
  FName local_60;
  undefined1 local_5c [12];
  undefined8 uStack_50;
  intmapsidedef_t *local_40;
  intmapsidedef_t *local_38;
  
  memset(sd,0,0xd8);
  local_38 = (intmapsidedef_t *)&sdt->bottomtexture;
  FString::operator=((FString *)local_38,"-");
  FString::operator=(&sdt->toptexture,"-");
  local_40 = (intmapsidedef_t *)&sdt->midtexture;
  FString::operator=((FString *)local_40,"-");
  sd->textures[2].xScale = 1.0;
  sd->textures[2].yScale = 1.0;
  sd->textures[1].xScale = 1.0;
  sd->textures[1].yScale = 1.0;
  sd->textures[0].xScale = 1.0;
  sd->textures[0].yScale = 1.0;
  sd->Index = index;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  bVar10 = FScanner::CheckToken((FScanner *)this,0x7d);
  stack0xffffffffffffffa8 = ZEXT816(0);
  if (!bVar10) {
    stack0xffffffffffffffa8 = ZEXT816(0);
    do {
      UDMFParserBase::ParseKey((UDMFParserBase *)local_5c,SUB81(this,0),(bool *)0x0);
      uVar9 = local_5c._0_4_;
      switch(local_5c._0_4_) {
      case 0x119:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Integer value expected for key \'%s\'",
                     FName::NameData.NameArray[0x119].Text);
        }
        local_5c._4_8_ = (double)(this->super_UDMFParserBase).sc.Number;
        break;
      case 0x11a:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Integer value expected for key \'%s\'",
                     FName::NameData.NameArray[0x11a].Text);
        }
        uStack_50 = (double)(this->super_UDMFParserBase).sc.Number;
        break;
      case 0x11b:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[0x11b].Text);
        }
        pcVar12 = (this->super_UDMFParserBase).parsedString.Chars;
        this_00 = sdt;
        goto LAB_0057d140;
      case 0x11c:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[0x11c].Text);
        }
        pcVar12 = (this->super_UDMFParserBase).parsedString.Chars;
        this_00 = local_38;
        goto LAB_0057d140;
      case 0x11d:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[0x11d].Text);
        }
        pcVar12 = (this->super_UDMFParserBase).parsedString.Chars;
        this_00 = local_40;
LAB_0057d140:
        FString::operator=(&this_00->toptexture,pcVar12);
        break;
      case 0x11e:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Integer value expected for key \'%s\'",
                     FName::NameData.NameArray[0x11e].Text);
        }
        sd->sector = (sector_t *)(long)(this->super_UDMFParserBase).sc.Number;
        break;
      default:
        uVar1 = (this->super_UDMFParserBase).namespace_bits;
        if ((uVar1 & 0x70) == 0) {
switchD_0057d214_default:
          if (((uVar1 & 0x30) != 0) &&
             (iVar11 = strncasecmp("user_",FName::NameData.NameArray[(int)local_5c._0_4_].Text,5),
             iVar11 == 0)) {
            local_60.Index = uVar9;
            AddUserKey(this,&local_60,1,index);
          }
          break;
        }
        if ((int)local_5c._0_4_ < 0x19c) {
          if (local_5c._0_4_ == 0x124) {
            pcVar12 = FName::NameData.NameArray[0x124].Text;
            iVar11 = 2;
          }
          else if (local_5c._0_4_ == 0x168) {
            pcVar12 = FName::NameData.NameArray[0x168].Text;
            iVar11 = 0x10;
          }
          else {
            if (local_5c._0_4_ != 0x169) goto switchD_0057d214_default;
            pcVar12 = FName::NameData.NameArray[0x169].Text;
            iVar11 = 0x20;
          }
          goto LAB_0057d67d;
        }
        switch(local_5c._0_4_) {
        case 0x19c:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x19c].Text);
          }
          sd->textures[0].xOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x19d:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x19d].Text);
          }
          sd->textures[0].yOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x19e:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x19e].Text);
          }
          sd->textures[1].xOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x19f:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x19f].Text);
          }
          sd->textures[1].yOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x1a0:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x1a0].Text);
          }
          sd->textures[2].xOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x1a1:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x1a1].Text);
          }
          sd->textures[2].yOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x1a2:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x1a2].Text);
          }
          dVar3 = (this->super_UDMFParserBase).sc.Float;
          uVar13 = -(ulong)(dVar3 == 0.0);
          sd->textures[0].xScale = (double)(~uVar13 & (ulong)dVar3 | uVar13 & 0x3ff0000000000000);
          break;
        case 0x1a3:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x1a3].Text);
          }
          dVar3 = (this->super_UDMFParserBase).sc.Float;
          uVar13 = -(ulong)(dVar3 == 0.0);
          sd->textures[0].yScale = (double)(~uVar13 & (ulong)dVar3 | uVar13 & 0x3ff0000000000000);
          break;
        case 0x1a4:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x1a4].Text);
          }
          dVar3 = (this->super_UDMFParserBase).sc.Float;
          uVar13 = -(ulong)(dVar3 == 0.0);
          sd->textures[1].xScale = (double)(~uVar13 & (ulong)dVar3 | uVar13 & 0x3ff0000000000000);
          break;
        case 0x1a5:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x1a5].Text);
          }
          dVar3 = (this->super_UDMFParserBase).sc.Float;
          uVar13 = -(ulong)(dVar3 == 0.0);
          sd->textures[1].yScale = (double)(~uVar13 & (ulong)dVar3 | uVar13 & 0x3ff0000000000000);
          break;
        case 0x1a6:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x1a6].Text);
          }
          dVar3 = (this->super_UDMFParserBase).sc.Float;
          uVar13 = -(ulong)(dVar3 == 0.0);
          sd->textures[2].xScale = (double)(~uVar13 & (ulong)dVar3 | uVar13 & 0x3ff0000000000000);
          break;
        case 0x1a7:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0x1a7].Text);
          }
          dVar3 = (this->super_UDMFParserBase).sc.Float;
          uVar13 = -(ulong)(dVar3 == 0.0);
          sd->textures[2].yScale = (double)(~uVar13 & (ulong)dVar3 | uVar13 & 0x3ff0000000000000);
          break;
        case 0x1a8:
          if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Integer value expected for key \'%s\'",
                       FName::NameData.NameArray[0x1a8].Text);
          }
          sd->Light = (SWORD)(this->super_UDMFParserBase).sc.Number;
          break;
        case 0x1a9:
          pcVar12 = FName::NameData.NameArray[0x1a9].Text;
          iVar11 = 1;
          goto LAB_0057d67d;
        case 0x1aa:
          pcVar12 = FName::NameData.NameArray[0x1aa].Text;
          iVar11 = 0x80;
          goto LAB_0057d67d;
        case 0x1ab:
          pcVar12 = FName::NameData.NameArray[0x1ab].Text;
          iVar11 = 4;
          goto LAB_0057d67d;
        case 0x1ac:
          pcVar12 = FName::NameData.NameArray[0x1ac].Text;
          iVar11 = 8;
LAB_0057d67d:
          UDMFParserBase::Flag<unsigned_char>(&this->super_UDMFParserBase,&sd->Flags,iVar11,pcVar12)
          ;
          break;
        default:
          goto switchD_0057d214_default;
        }
      }
      bVar10 = FScanner::CheckToken((FScanner *)this,0x7d);
    } while (!bVar10);
  }
  dVar5 = sd->textures[1].xOffset;
  dVar6 = sd->textures[1].yOffset;
  dVar7 = sd->textures[2].xOffset;
  dVar8 = sd->textures[2].yOffset;
  dVar3 = sd->textures[0].xOffset + (double)local_5c._4_8_;
  dVar4 = sd->textures[0].yOffset + uStack_50;
  auVar2._8_4_ = SUB84(dVar4,0);
  auVar2._0_8_ = dVar3;
  auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
  sd->textures[0].xOffset = dVar3;
  sd->textures[0].yOffset = (double)auVar2._8_8_;
  sd->textures[1].xOffset = dVar5 + (double)local_5c._4_8_;
  sd->textures[1].yOffset = dVar6 + uStack_50;
  sd->textures[2].xOffset = dVar7 + (double)local_5c._4_8_;
  sd->textures[2].yOffset = dVar8 + uStack_50;
  return;
}

Assistant:

void ParseSidedef(side_t *sd, intmapsidedef_t *sdt, int index)
	{
		double texOfs[2]={0,0};

		memset(sd, 0, sizeof(*sd));
		sdt->bottomtexture = "-";
		sdt->toptexture = "-";
		sdt->midtexture = "-";
		sd->SetTextureXScale(1.);
		sd->SetTextureYScale(1.);
		sd->Index = index;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Offsetx:
				texOfs[0] = CheckInt(key);
				continue;

			case NAME_Offsety:
				texOfs[1] = CheckInt(key);
				continue;

			case NAME_Texturetop:
				sdt->toptexture = CheckString(key);
				continue;

			case NAME_Texturebottom:
				sdt->bottomtexture = CheckString(key);
				continue;

			case NAME_Texturemiddle:
				sdt->midtexture = CheckString(key);
				continue;

			case NAME_Sector:
				sd->sector = (sector_t*)(intptr_t)CheckInt(key);
				continue;

			default:
				break;
			}

			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
			case NAME_offsetx_top:
				sd->SetTextureXOffset(side_t::top, CheckFloat(key));
				continue;

			case NAME_offsety_top:
				sd->SetTextureYOffset(side_t::top, CheckFloat(key));
				continue;

			case NAME_offsetx_mid:
				sd->SetTextureXOffset(side_t::mid, CheckFloat(key));
				continue;

			case NAME_offsety_mid:
				sd->SetTextureYOffset(side_t::mid, CheckFloat(key));
				continue;

			case NAME_offsetx_bottom:
				sd->SetTextureXOffset(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_offsety_bottom:
				sd->SetTextureYOffset(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_scalex_top:
				sd->SetTextureXScale(side_t::top, CheckFloat(key));
				continue;

			case NAME_scaley_top:
				sd->SetTextureYScale(side_t::top, CheckFloat(key));
				continue;

			case NAME_scalex_mid:
				sd->SetTextureXScale(side_t::mid, CheckFloat(key));
				continue;

			case NAME_scaley_mid:
				sd->SetTextureYScale(side_t::mid, CheckFloat(key));
				continue;

			case NAME_scalex_bottom:
				sd->SetTextureXScale(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_scaley_bottom:
				sd->SetTextureYScale(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_light:
				sd->SetLight(CheckInt(key));
				continue;

			case NAME_lightabsolute:
				Flag(sd->Flags, WALLF_ABSLIGHTING, key);
				continue;

			case NAME_lightfog:
				Flag(sd->Flags, WALLF_LIGHT_FOG, key);
				continue;

			case NAME_nofakecontrast:
				Flag(sd->Flags, WALLF_NOFAKECONTRAST, key);
				continue;

			case NAME_smoothlighting:
				Flag(sd->Flags, WALLF_SMOOTHLIGHTING, key);
				continue;

			case NAME_Wrapmidtex:
				Flag(sd->Flags, WALLF_WRAP_MIDTEX, key);
				continue;

			case NAME_Clipmidtex:
				Flag(sd->Flags, WALLF_CLIP_MIDTEX, key);
				continue;

			case NAME_Nodecals:
				Flag(sd->Flags, WALLF_NOAUTODECALS, key);
				continue;

			default:
				break;

			}
			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Side, index);
			}
		}
		// initialization of these is delayed to allow separate offsets and add them with the global ones.
		sd->AddTextureXOffset(side_t::top, texOfs[0]);
		sd->AddTextureXOffset(side_t::mid, texOfs[0]);
		sd->AddTextureXOffset(side_t::bottom, texOfs[0]);
		sd->AddTextureYOffset(side_t::top, texOfs[1]);
		sd->AddTextureYOffset(side_t::mid, texOfs[1]);
		sd->AddTextureYOffset(side_t::bottom, texOfs[1]);
	}